

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O1

char * rank_of(int lev,short monnum,boolean female)

{
  Role *pRVar1;
  char *pcVar2;
  bool bVar3;
  Role *pRVar4;
  char *pcVar5;
  Role *pRVar6;
  uint uVar7;
  
  pRVar4 = roles;
  do {
    pRVar6 = pRVar4;
    if ((pRVar4->malenum == monnum) || (pRVar4->femalenum == monnum)) break;
    pRVar1 = pRVar4 + 1;
    pRVar4 = pRVar4 + 1;
    pRVar6 = &urole;
  } while ((pRVar1->name).m != (char *)0x0);
  uVar7 = 0;
  if ((2 < lev) && (uVar7 = 8, lev < 0x1f)) {
    uVar7 = lev + 2U >> 2;
  }
  do {
    if ((female != '\0') && (pcVar2 = pRVar6->rank[uVar7].f, pcVar2 != (char *)0x0)) {
      return pcVar2;
    }
    pcVar2 = pRVar6->rank[uVar7].m;
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    bVar3 = 0 < (int)uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar3);
  if ((female != '\0') && (pcVar2 = (pRVar6->name).f, pcVar2 != (char *)0x0)) {
    return pcVar2;
  }
  pcVar2 = (pRVar6->name).m;
  pcVar5 = "Player";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  return pcVar5;
}

Assistant:

const char *rank_of(int lev, short monnum, boolean female)
{
	struct Role *role;
	int i;


	/* Find the role */
	for (role = (struct Role *) roles; role->name.m; role++)
	    if (monnum == role->malenum || monnum == role->femalenum)
	    	break;
	if (!role->name.m)
	    role = &urole;

	/* Find the rank */
	for (i = xlev_to_rank((int)lev); i >= 0; i--) {
	    if (female && role->rank[i].f) return role->rank[i].f;
	    if (role->rank[i].m) return role->rank[i].m;
	}

	/* Try the role name, instead */
	if (female && role->name.f) return role->name.f;
	else if (role->name.m) return role->name.m;
	return "Player";
}